

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<QString,QSize>::emplace<QSize_const&>(QHash<QString,_QSize> *this,QString *key,QSize *args)

{
  QString *in_RDI;
  long in_FS_OFFSET;
  piter pVar1;
  QString copy;
  QString *in_stack_ffffffffffffff88;
  QSize *args_00;
  QString *in_stack_ffffffffffffffa0;
  QHash<QString,_QSize> *in_stack_ffffffffffffffa8;
  QSize local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  args_00 = &local_28;
  QString::QString(in_RDI,in_stack_ffffffffffffff88);
  pVar1 = (piter)emplace<QSize_const&>(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,args_00);
  QString::~QString((QString *)0x6bc816);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)pVar1;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(const Key &key, Args &&... args)
    {
        Key copy = key; // Needs to be explicit for MSVC 2019
        return emplace(std::move(copy), std::forward<Args>(args)...);
    }